

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_output_pack8_avx
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined8 *puVar29;
  long lVar30;
  long lVar31;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _out03;
  __m256 _out02;
  __m256 _out01;
  __m256 _out00;
  __m256 _tmp13b_1;
  __m256 _tmp02b_1;
  __m256 _tmp13a_1;
  __m256 _tmp02a_1;
  __m256 _tmp05;
  __m256 _tmp04;
  __m256 _tmp03;
  __m256 _tmp02;
  __m256 _tmp01;
  __m256 _tmp00;
  int m_3;
  __m256 _tmp3m;
  __m256 _tmp2m;
  __m256 _tmp1m;
  __m256 _tmp0m;
  __m256 _tmp13b;
  __m256 _tmp02b;
  __m256 _tmp13a;
  __m256 _tmp02a;
  __m256 _out0tm5;
  __m256 _out0tm4;
  __m256 _out0tm3;
  __m256 _out0tm2;
  __m256 _out0tm1;
  __m256 _out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_5;
  float *output0_tm_4;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  float tmp [4] [6] [8];
  __m256 _bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  int local_15c4;
  int local_13e4;
  undefined8 *local_13e0;
  undefined8 *local_13d8;
  undefined1 (*local_13d0) [32];
  undefined1 (*local_13c8) [32];
  undefined1 (*local_13c0) [32];
  undefined1 (*local_13b8) [32];
  undefined8 *local_13b0;
  int local_13a8;
  int local_13a4;
  undefined8 local_13a0 [105];
  long local_1058;
  undefined8 local_1050;
  long local_1048;
  undefined4 local_1040;
  long local_1038;
  int local_102c;
  undefined4 local_1028;
  undefined4 local_1024;
  undefined4 local_1020;
  long local_1010;
  undefined8 local_1008;
  long local_1000;
  undefined4 local_ff8;
  long local_ff0;
  undefined4 local_fe4;
  undefined4 local_fe0;
  undefined4 local_fdc;
  undefined4 local_fd8;
  int local_fc4;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar25 = in_RSI[7];
  iVar26 = iVar1 / 4;
  iVar27 = (int)in_RSI[6] / 4;
  iVar28 = iVar26 * iVar27;
  lVar2 = *in_RDX;
  for (local_fc4 = 0; local_fc4 < (int)lVar25; local_fc4 = local_fc4 + 1) {
    local_1010 = *in_RDI + in_RDI[8] * (long)local_fc4 * in_RDI[2];
    local_1008 = 0;
    local_1000 = in_RDI[2];
    local_ff8 = (int)in_RDI[3];
    local_ff0 = in_RDI[4];
    local_fe4 = *(undefined4 *)((long)in_RDI + 0x2c);
    local_fe0 = (int)in_RDI[6];
    local_fdc = 1;
    local_fd8 = *(undefined4 *)((long)in_RDI + 0x34);
    local_102c = *(int *)((long)in_RSI + 0x2c);
    local_1058 = *in_RSI + in_RSI[8] * (long)local_fc4 * in_RSI[2];
    local_1048 = in_RSI[2];
    local_1050 = 0;
    local_1040 = (int)in_RSI[3];
    local_1038 = in_RSI[4];
    local_1028 = (int)in_RSI[6];
    local_1024 = 1;
    local_1020 = *(undefined4 *)((long)in_RSI + 0x34);
    if (lVar2 == 0) {
      local_1800 = 0;
      uStack_17f8 = 0;
      uStack_17f0 = 0;
      uStack_17e8 = 0;
    }
    else {
      puVar29 = (undefined8 *)(lVar2 + (long)(local_fc4 << 3) * 4);
      local_1800 = *puVar29;
      uStack_17f8 = puVar29[1];
      uStack_17f0 = puVar29[2];
      uStack_17e8 = puVar29[3];
    }
    local_13a0[0x60] = local_1800;
    local_13a0[0x61] = uStack_17f8;
    local_13a0[0x62] = uStack_17f0;
    for (local_13a4 = 0; local_13a4 < iVar27; local_13a4 = local_13a4 + 1) {
      for (local_13a8 = 0; local_13a8 < iVar26; local_13a8 = local_13a8 + 1) {
        local_13b0 = (undefined8 *)(local_1010 + (long)((local_13a4 * iVar26 + local_13a8) * 8) * 4)
        ;
        local_13b8 = (undefined1 (*) [32])((long)local_13b0 + (long)(iVar28 * 8) * 4);
        local_13c0 = (undefined1 (*) [32])((long)local_13b0 + (long)(iVar28 * 0x10) * 4);
        local_13c8 = (undefined1 (*) [32])((long)local_13b0 + (long)(iVar28 * 0x18) * 4);
        local_13d0 = (undefined1 (*) [32])((long)local_13b0 + (long)(iVar28 * 0x20) * 4);
        local_13d8 = (undefined8 *)((long)local_13b0 + (long)(iVar28 * 0x28) * 4);
        local_13e0 = (undefined8 *)
                     (local_1058 + (long)local_102c * (long)(local_13a4 << 2) * local_1048 +
                     (long)(local_13a8 << 5) * 4);
        for (local_13e4 = 0; local_13e4 < 6; local_13e4 = local_13e4 + 1) {
          local_600 = (float)*(undefined8 *)*local_13b8;
          fStack_5fc = (float)((ulong)*(undefined8 *)*local_13b8 >> 0x20);
          fStack_5f8 = (float)*(undefined8 *)(*local_13b8 + 8);
          fStack_5f4 = (float)((ulong)*(undefined8 *)(*local_13b8 + 8) >> 0x20);
          fStack_5f0 = (float)*(undefined8 *)(*local_13b8 + 0x10);
          fStack_5ec = (float)((ulong)*(undefined8 *)(*local_13b8 + 0x10) >> 0x20);
          fStack_5e8 = (float)*(undefined8 *)(*local_13b8 + 0x18);
          fStack_5e4 = (float)((ulong)*(undefined8 *)(*local_13b8 + 0x18) >> 0x20);
          local_620 = (float)*(undefined8 *)*local_13c0;
          fStack_61c = (float)((ulong)*(undefined8 *)*local_13c0 >> 0x20);
          fStack_618 = (float)*(undefined8 *)(*local_13c0 + 8);
          fStack_614 = (float)((ulong)*(undefined8 *)(*local_13c0 + 8) >> 0x20);
          fStack_610 = (float)*(undefined8 *)(*local_13c0 + 0x10);
          fStack_60c = (float)((ulong)*(undefined8 *)(*local_13c0 + 0x10) >> 0x20);
          fStack_608 = (float)*(undefined8 *)(*local_13c0 + 0x18);
          fStack_604 = (float)((ulong)*(undefined8 *)(*local_13c0 + 0x18) >> 0x20);
          auVar5 = vsubps_avx(*local_13b8,*local_13c0);
          local_640 = (float)*(undefined8 *)*local_13c8;
          fStack_63c = (float)((ulong)*(undefined8 *)*local_13c8 >> 0x20);
          fStack_638 = (float)*(undefined8 *)(*local_13c8 + 8);
          fStack_634 = (float)((ulong)*(undefined8 *)(*local_13c8 + 8) >> 0x20);
          fStack_630 = (float)*(undefined8 *)(*local_13c8 + 0x10);
          fStack_62c = (float)((ulong)*(undefined8 *)(*local_13c8 + 0x10) >> 0x20);
          fStack_628 = (float)*(undefined8 *)(*local_13c8 + 0x18);
          fStack_624 = (float)((ulong)*(undefined8 *)(*local_13c8 + 0x18) >> 0x20);
          local_660 = (float)*(undefined8 *)*local_13d0;
          fStack_65c = (float)((ulong)*(undefined8 *)*local_13d0 >> 0x20);
          fStack_658 = (float)*(undefined8 *)(*local_13d0 + 8);
          fStack_654 = (float)((ulong)*(undefined8 *)(*local_13d0 + 8) >> 0x20);
          fStack_650 = (float)*(undefined8 *)(*local_13d0 + 0x10);
          fStack_64c = (float)((ulong)*(undefined8 *)(*local_13d0 + 0x10) >> 0x20);
          fStack_648 = (float)*(undefined8 *)(*local_13d0 + 0x18);
          fStack_644 = (float)((ulong)*(undefined8 *)(*local_13d0 + 0x18) >> 0x20);
          auVar6 = vsubps_avx(*local_13c8,*local_13d0);
          local_680 = (float)*local_13b0;
          fStack_67c = (float)((ulong)*local_13b0 >> 0x20);
          fStack_678 = (float)local_13b0[1];
          fStack_674 = (float)((ulong)local_13b0[1] >> 0x20);
          fStack_670 = (float)local_13b0[2];
          fStack_66c = (float)((ulong)local_13b0[2] >> 0x20);
          fStack_668 = (float)local_13b0[3];
          fStack_664 = (float)((ulong)local_13b0[3] >> 0x20);
          auVar3 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40000000),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40000000),0x30);
          auVar4 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40000000),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40000000),0x30);
          local_b00 = auVar4._0_4_;
          fStack_afc = auVar4._4_4_;
          fStack_af8 = auVar4._8_4_;
          fStack_af4 = auVar4._12_4_;
          fStack_af0 = auVar3._0_4_;
          fStack_aec = auVar3._4_4_;
          fStack_ae8 = auVar3._8_4_;
          fStack_ae4 = auVar3._12_4_;
          local_5e0 = auVar6._0_4_;
          fStack_5dc = auVar6._4_4_;
          fStack_5d8 = auVar6._8_4_;
          fStack_5d4 = auVar6._12_4_;
          fStack_5d0 = auVar6._16_4_;
          fStack_5cc = auVar6._20_4_;
          fStack_5c8 = auVar6._24_4_;
          local_ae0 = auVar5._0_4_;
          fStack_adc = auVar5._4_4_;
          fStack_ad8 = auVar5._8_4_;
          fStack_ad4 = auVar5._12_4_;
          fStack_ad0 = auVar5._16_4_;
          fStack_acc = auVar5._20_4_;
          fStack_ac8 = auVar5._24_4_;
          fStack_ac4 = auVar5._28_4_;
          auVar3 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40800000),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40800000),0x30);
          auVar4 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40800000),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40800000),0x30);
          local_b60 = auVar4._0_4_;
          fStack_b5c = auVar4._4_4_;
          fStack_b58 = auVar4._8_4_;
          fStack_b54 = auVar4._12_4_;
          fStack_b50 = auVar3._0_4_;
          fStack_b4c = auVar3._4_4_;
          fStack_b48 = auVar3._8_4_;
          fStack_b44 = auVar3._12_4_;
          auVar3 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x41000000),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x41000000),0x30);
          auVar4 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x41000000),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x41000000),0x30);
          local_700 = (float)*local_13d8;
          fStack_6fc = (float)((ulong)*local_13d8 >> 0x20);
          fStack_6f8 = (float)local_13d8[1];
          fStack_6f4 = (float)((ulong)local_13d8[1] >> 0x20);
          fStack_6f0 = (float)local_13d8[2];
          fStack_6ec = (float)((ulong)local_13d8[2] >> 0x20);
          fStack_6e8 = (float)local_13d8[3];
          fStack_6e4 = (float)((ulong)local_13d8[3] >> 0x20);
          local_bc0 = auVar4._0_4_;
          fStack_bbc = auVar4._4_4_;
          fStack_bb8 = auVar4._8_4_;
          fStack_bb4 = auVar4._12_4_;
          fStack_bb0 = auVar3._0_4_;
          fStack_bac = auVar3._4_4_;
          fStack_ba8 = auVar3._8_4_;
          fStack_ba4 = auVar3._12_4_;
          lVar31 = (long)local_13e4;
          local_13a0[lVar31 * 4] =
               CONCAT44(fStack_67c + fStack_5fc + fStack_61c + fStack_63c + fStack_65c,
                        local_680 + local_600 + local_620 + local_640 + local_660);
          local_13a0[lVar31 * 4 + 1] =
               CONCAT44(fStack_674 + fStack_5f4 + fStack_614 + fStack_634 + fStack_654,
                        fStack_678 + fStack_5f8 + fStack_618 + fStack_638 + fStack_658);
          local_13a0[lVar31 * 4 + 2] =
               CONCAT44(fStack_66c + fStack_5ec + fStack_60c + fStack_62c + fStack_64c,
                        fStack_670 + fStack_5f0 + fStack_610 + fStack_630 + fStack_650);
          local_13a0[lVar31 * 4 + 3] =
               CONCAT44(fStack_664 + fStack_5e4 + fStack_604 + fStack_624 + fStack_644,
                        fStack_668 + fStack_5e8 + fStack_608 + fStack_628 + fStack_648);
          lVar31 = (long)local_13e4;
          local_13a0[lVar31 * 4 + 0x18] =
               CONCAT44(fStack_afc * fStack_5dc + fStack_adc,local_b00 * local_5e0 + local_ae0);
          local_13a0[lVar31 * 4 + 0x19] =
               CONCAT44(fStack_af4 * fStack_5d4 + fStack_ad4,fStack_af8 * fStack_5d8 + fStack_ad8);
          local_13a0[lVar31 * 4 + 0x1a] =
               CONCAT44(fStack_aec * fStack_5cc + fStack_acc,fStack_af0 * fStack_5d0 + fStack_ad0);
          local_13a0[lVar31 * 4 + 0x1b] =
               CONCAT44(fStack_ae4 + fStack_ac4,fStack_ae8 * fStack_5c8 + fStack_ac8);
          lVar31 = (long)local_13e4;
          local_13a0[lVar31 * 4 + 0x30] =
               CONCAT44(fStack_b5c * (fStack_63c + fStack_65c) + fStack_5fc + fStack_61c,
                        local_b60 * (local_640 + local_660) + local_600 + local_620);
          local_13a0[lVar31 * 4 + 0x31] =
               CONCAT44(fStack_b54 * (fStack_634 + fStack_654) + fStack_5f4 + fStack_614,
                        fStack_b58 * (fStack_638 + fStack_658) + fStack_5f8 + fStack_618);
          local_13a0[lVar31 * 4 + 0x32] =
               CONCAT44(fStack_b4c * (fStack_62c + fStack_64c) + fStack_5ec + fStack_60c,
                        fStack_b50 * (fStack_630 + fStack_650) + fStack_5f0 + fStack_610);
          local_13a0[lVar31 * 4 + 0x33] =
               CONCAT44(fStack_b44 + fStack_5e4 + fStack_604,
                        fStack_b48 * (fStack_628 + fStack_648) + fStack_5e8 + fStack_608);
          lVar31 = (long)local_13e4;
          local_13a0[lVar31 * 4 + 0x48] =
               CONCAT44(fStack_bbc * fStack_5dc + fStack_6fc + fStack_adc,
                        local_bc0 * local_5e0 + local_700 + local_ae0);
          local_13a0[lVar31 * 4 + 0x49] =
               CONCAT44(fStack_bb4 * fStack_5d4 + fStack_6f4 + fStack_ad4,
                        fStack_bb8 * fStack_5d8 + fStack_6f8 + fStack_ad8);
          local_13a0[lVar31 * 4 + 0x4a] =
               CONCAT44(fStack_bac * fStack_5cc + fStack_6ec + fStack_acc,
                        fStack_bb0 * fStack_5d0 + fStack_6f0 + fStack_ad0);
          local_13a0[lVar31 * 4 + 0x4b] =
               CONCAT44(fStack_ba4 + fStack_6e4 + fStack_ac4,
                        fStack_ba8 * fStack_5c8 + fStack_6e8 + fStack_ac8);
          local_13b0 = (undefined8 *)((long)local_13b0 + (long)(iVar28 * 0x30) * 4);
          local_13b8 = (undefined1 (*) [32])(*local_13b8 + (long)(iVar28 * 0x30) * 4);
          local_13c0 = (undefined1 (*) [32])(*local_13c0 + (long)(iVar28 * 0x30) * 4);
          local_13c8 = (undefined1 (*) [32])(*local_13c8 + (long)(iVar28 * 0x30) * 4);
          local_13d0 = (undefined1 (*) [32])(*local_13d0 + (long)(iVar28 * 0x30) * 4);
          local_13d8 = (undefined8 *)((long)local_13d8 + (long)(iVar28 * 0x30) * 4);
        }
        for (local_15c4 = 0; local_15c4 < 4; local_15c4 = local_15c4 + 1) {
          lVar31 = (long)local_15c4;
          lVar30 = (long)local_15c4;
          uVar7 = local_13a0[lVar30 * 0x18 + 4];
          uVar8 = local_13a0[lVar30 * 0x18 + 5];
          uVar9 = local_13a0[lVar30 * 0x18 + 6];
          uVar10 = local_13a0[lVar30 * 0x18 + 7];
          lVar30 = (long)local_15c4;
          uVar11 = local_13a0[lVar30 * 0x18 + 8];
          uVar12 = local_13a0[lVar30 * 0x18 + 9];
          uVar13 = local_13a0[lVar30 * 0x18 + 10];
          uVar14 = local_13a0[lVar30 * 0x18 + 0xb];
          lVar30 = (long)local_15c4;
          uVar15 = local_13a0[lVar30 * 0x18 + 0xc];
          uVar16 = local_13a0[lVar30 * 0x18 + 0xd];
          uVar17 = local_13a0[lVar30 * 0x18 + 0xe];
          uVar18 = local_13a0[lVar30 * 0x18 + 0xf];
          lVar30 = (long)local_15c4;
          uVar19 = local_13a0[lVar30 * 0x18 + 0x10];
          uVar20 = local_13a0[lVar30 * 0x18 + 0x11];
          uVar21 = local_13a0[lVar30 * 0x18 + 0x12];
          uVar22 = local_13a0[lVar30 * 0x18 + 0x13];
          lVar30 = (long)local_15c4;
          local_740 = (float)uVar7;
          fStack_73c = (float)((ulong)uVar7 >> 0x20);
          fStack_738 = (float)uVar8;
          fStack_734 = (float)((ulong)uVar8 >> 0x20);
          fStack_730 = (float)uVar9;
          fStack_72c = (float)((ulong)uVar9 >> 0x20);
          fStack_728 = (float)uVar10;
          fStack_724 = (float)((ulong)uVar10 >> 0x20);
          local_760 = (float)uVar11;
          fStack_75c = (float)((ulong)uVar11 >> 0x20);
          fStack_758 = (float)uVar12;
          fStack_754 = (float)((ulong)uVar12 >> 0x20);
          fStack_750 = (float)uVar13;
          fStack_74c = (float)((ulong)uVar13 >> 0x20);
          fStack_748 = (float)uVar14;
          fStack_744 = (float)((ulong)uVar14 >> 0x20);
          auVar24._8_8_ = uVar8;
          auVar24._0_8_ = uVar7;
          auVar24._16_8_ = uVar9;
          auVar24._24_8_ = uVar10;
          auVar5._8_8_ = uVar12;
          auVar5._0_8_ = uVar11;
          auVar5._16_8_ = uVar13;
          auVar5._24_8_ = uVar14;
          auVar5 = vsubps_avx(auVar24,auVar5);
          local_780 = (float)uVar15;
          fStack_77c = (float)((ulong)uVar15 >> 0x20);
          fStack_778 = (float)uVar16;
          fStack_774 = (float)((ulong)uVar16 >> 0x20);
          fStack_770 = (float)uVar17;
          fStack_76c = (float)((ulong)uVar17 >> 0x20);
          fStack_768 = (float)uVar18;
          fStack_764 = (float)((ulong)uVar18 >> 0x20);
          local_7a0 = (float)uVar19;
          fStack_79c = (float)((ulong)uVar19 >> 0x20);
          fStack_798 = (float)uVar20;
          fStack_794 = (float)((ulong)uVar20 >> 0x20);
          fStack_790 = (float)uVar21;
          fStack_78c = (float)((ulong)uVar21 >> 0x20);
          fStack_788 = (float)uVar22;
          fStack_784 = (float)((ulong)uVar22 >> 0x20);
          auVar23._8_8_ = uVar16;
          auVar23._0_8_ = uVar15;
          auVar23._16_8_ = uVar17;
          auVar23._24_8_ = uVar18;
          auVar6._8_8_ = uVar20;
          auVar6._0_8_ = uVar19;
          auVar6._16_8_ = uVar21;
          auVar6._24_8_ = uVar22;
          auVar6 = vsubps_avx(auVar23,auVar6);
          local_7c0 = (float)local_13a0[lVar31 * 0x18];
          fStack_7bc = (float)((ulong)local_13a0[lVar31 * 0x18] >> 0x20);
          fStack_7b8 = (float)local_13a0[lVar31 * 0x18 + 1];
          fStack_7b4 = (float)((ulong)local_13a0[lVar31 * 0x18 + 1] >> 0x20);
          fStack_7b0 = (float)local_13a0[lVar31 * 0x18 + 2];
          fStack_7ac = (float)((ulong)local_13a0[lVar31 * 0x18 + 2] >> 0x20);
          fStack_7a8 = (float)local_13a0[lVar31 * 0x18 + 3];
          fStack_7a4 = (float)((ulong)local_13a0[lVar31 * 0x18 + 3] >> 0x20);
          local_840 = (float)local_13a0[0x60];
          fStack_83c = (float)((ulong)local_13a0[0x60] >> 0x20);
          fStack_838 = (float)local_13a0[0x61];
          fStack_834 = (float)((ulong)local_13a0[0x61] >> 0x20);
          fStack_830 = (float)local_13a0[0x62];
          fStack_82c = (float)((ulong)local_13a0[0x62] >> 0x20);
          fStack_828 = (float)uStack_17e8;
          fStack_824 = (float)((ulong)uStack_17e8 >> 0x20);
          auVar3 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40000000),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40000000),0x30);
          auVar4 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40000000),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40000000),0x30);
          local_c20 = auVar4._0_4_;
          fStack_c1c = auVar4._4_4_;
          fStack_c18 = auVar4._8_4_;
          fStack_c14 = auVar4._12_4_;
          fStack_c10 = auVar3._0_4_;
          fStack_c0c = auVar3._4_4_;
          fStack_c08 = auVar3._8_4_;
          fStack_c04 = auVar3._12_4_;
          local_520 = auVar6._0_4_;
          fStack_51c = auVar6._4_4_;
          fStack_518 = auVar6._8_4_;
          fStack_514 = auVar6._12_4_;
          fStack_510 = auVar6._16_4_;
          fStack_50c = auVar6._20_4_;
          fStack_508 = auVar6._24_4_;
          local_a20 = auVar5._0_4_;
          fStack_a1c = auVar5._4_4_;
          fStack_a18 = auVar5._8_4_;
          fStack_a14 = auVar5._12_4_;
          fStack_a10 = auVar5._16_4_;
          fStack_a0c = auVar5._20_4_;
          fStack_a08 = auVar5._24_4_;
          fStack_a04 = auVar5._28_4_;
          auVar3 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40800000),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40800000),0x30);
          auVar4 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40800000),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40800000),0x30);
          local_c80 = auVar4._0_4_;
          fStack_c7c = auVar4._4_4_;
          fStack_c78 = auVar4._8_4_;
          fStack_c74 = auVar4._12_4_;
          fStack_c70 = auVar3._0_4_;
          fStack_c6c = auVar3._4_4_;
          fStack_c68 = auVar3._8_4_;
          fStack_c64 = auVar3._12_4_;
          auVar3 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x41000000),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0x41000000),0x30);
          auVar4 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x41000000),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(0x41000000),0x30);
          local_900 = (float)local_13a0[lVar30 * 0x18 + 0x14];
          fStack_8fc = (float)((ulong)local_13a0[lVar30 * 0x18 + 0x14] >> 0x20);
          fStack_8f8 = (float)local_13a0[lVar30 * 0x18 + 0x15];
          fStack_8f4 = (float)((ulong)local_13a0[lVar30 * 0x18 + 0x15] >> 0x20);
          fStack_8f0 = (float)local_13a0[lVar30 * 0x18 + 0x16];
          fStack_8ec = (float)((ulong)local_13a0[lVar30 * 0x18 + 0x16] >> 0x20);
          fStack_8e8 = (float)local_13a0[lVar30 * 0x18 + 0x17];
          fStack_8e4 = (float)((ulong)local_13a0[lVar30 * 0x18 + 0x17] >> 0x20);
          local_ce0 = auVar4._0_4_;
          fStack_cdc = auVar4._4_4_;
          fStack_cd8 = auVar4._8_4_;
          fStack_cd4 = auVar4._12_4_;
          fStack_cd0 = auVar3._0_4_;
          fStack_ccc = auVar3._4_4_;
          fStack_cc8 = auVar3._8_4_;
          fStack_cc4 = auVar3._12_4_;
          *local_13e0 = CONCAT44(fStack_83c +
                                 fStack_7bc + fStack_73c + fStack_75c + fStack_77c + fStack_79c,
                                 local_840 +
                                 local_7c0 + local_740 + local_760 + local_780 + local_7a0);
          local_13e0[1] =
               CONCAT44(fStack_834 + fStack_7b4 + fStack_734 + fStack_754 + fStack_774 + fStack_794,
                        fStack_838 + fStack_7b8 + fStack_738 + fStack_758 + fStack_778 + fStack_798)
          ;
          local_13e0[2] =
               CONCAT44(fStack_82c + fStack_7ac + fStack_72c + fStack_74c + fStack_76c + fStack_78c,
                        fStack_830 + fStack_7b0 + fStack_730 + fStack_750 + fStack_770 + fStack_790)
          ;
          local_13e0[3] =
               CONCAT44(fStack_824 + fStack_7a4 + fStack_724 + fStack_744 + fStack_764 + fStack_784,
                        fStack_828 + fStack_7a8 + fStack_728 + fStack_748 + fStack_768 + fStack_788)
          ;
          local_13e0[4] =
               CONCAT44(fStack_83c + fStack_c1c * fStack_51c + fStack_a1c,
                        local_840 + local_c20 * local_520 + local_a20);
          local_13e0[5] =
               CONCAT44(fStack_834 + fStack_c14 * fStack_514 + fStack_a14,
                        fStack_838 + fStack_c18 * fStack_518 + fStack_a18);
          local_13e0[6] =
               CONCAT44(fStack_82c + fStack_c0c * fStack_50c + fStack_a0c,
                        fStack_830 + fStack_c10 * fStack_510 + fStack_a10);
          local_13e0[7] =
               CONCAT44(fStack_824 + fStack_c04 + fStack_a04,
                        fStack_828 + fStack_c08 * fStack_508 + fStack_a08);
          local_13e0[8] =
               CONCAT44(fStack_83c +
                        fStack_c7c * (fStack_77c + fStack_79c) + fStack_73c + fStack_75c,
                        local_840 + local_c80 * (local_780 + local_7a0) + local_740 + local_760);
          local_13e0[9] =
               CONCAT44(fStack_834 +
                        fStack_c74 * (fStack_774 + fStack_794) + fStack_734 + fStack_754,
                        fStack_838 +
                        fStack_c78 * (fStack_778 + fStack_798) + fStack_738 + fStack_758);
          local_13e0[10] =
               CONCAT44(fStack_82c +
                        fStack_c6c * (fStack_76c + fStack_78c) + fStack_72c + fStack_74c,
                        fStack_830 +
                        fStack_c70 * (fStack_770 + fStack_790) + fStack_730 + fStack_750);
          local_13e0[0xb] =
               CONCAT44(fStack_824 + fStack_c64 + fStack_724 + fStack_744,
                        fStack_828 +
                        fStack_c68 * (fStack_768 + fStack_788) + fStack_728 + fStack_748);
          local_13e0[0xc] =
               CONCAT44(fStack_83c + fStack_cdc * fStack_51c + fStack_8fc + fStack_a1c,
                        local_840 + local_ce0 * local_520 + local_900 + local_a20);
          local_13e0[0xd] =
               CONCAT44(fStack_834 + fStack_cd4 * fStack_514 + fStack_8f4 + fStack_a14,
                        fStack_838 + fStack_cd8 * fStack_518 + fStack_8f8 + fStack_a18);
          local_13e0[0xe] =
               CONCAT44(fStack_82c + fStack_ccc * fStack_50c + fStack_8ec + fStack_a0c,
                        fStack_830 + fStack_cd0 * fStack_510 + fStack_8f0 + fStack_a10);
          local_13e0[0xf] =
               CONCAT44(fStack_824 + fStack_cc4 + fStack_8e4 + fStack_a04,
                        fStack_828 + fStack_cc8 * fStack_508 + fStack_8e8 + fStack_a08);
          local_13e0 = (undefined8 *)((long)local_13e0 + (long)(iVar1 << 3) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_output_pack8_avx(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 4;
    const int h_tiles = outh / 4;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[4][6] = {
    //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
    //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
    //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
    //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
    // };

    // 0 = r00 + (r01 + r02) + (r03 + r04)
    // 1 =       (r01 - r02) + (r03 - r04) * 2
    // 2 =       (r01 + r02) + (r03 + r04) * 4
    // 3 = r05 + (r01 - r02) + (r03 - r04) * 8

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = biasptr ? _mm256_loadu_ps(biasptr + p * 8) : _mm256_setzero_ps();

#ifdef _MSC_VER
        __declspec(align(32))
#else
        __attribute__((aligned(32)))
#endif
        float tmp[4][6][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 8;
                const float* output0_tm_1 = output0_tm_0 + tiles * 8;
                const float* output0_tm_2 = output0_tm_0 + tiles * 8 * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 8 * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 8 * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 8 * 5;

                float* output0 = out0.row(i * 4) + (j * 4) * 8;

                for (int m = 0; m < 6; m++)
                {
                    __m256 _out0tm0 = _mm256_load_ps(output0_tm_0);
                    __m256 _out0tm1 = _mm256_load_ps(output0_tm_1);
                    __m256 _out0tm2 = _mm256_load_ps(output0_tm_2);
                    __m256 _out0tm3 = _mm256_load_ps(output0_tm_3);
                    __m256 _out0tm4 = _mm256_load_ps(output0_tm_4);
                    __m256 _out0tm5 = _mm256_load_ps(output0_tm_5);

                    __m256 _tmp02a = _mm256_add_ps(_out0tm1, _out0tm2);
                    __m256 _tmp13a = _mm256_sub_ps(_out0tm1, _out0tm2);

                    __m256 _tmp02b = _mm256_add_ps(_out0tm3, _out0tm4);
                    __m256 _tmp13b = _mm256_sub_ps(_out0tm3, _out0tm4);

                    __m256 _tmp0m = _mm256_add_ps(_mm256_add_ps(_out0tm0, _tmp02a), _tmp02b);
                    __m256 _tmp1m = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp13b, _tmp13a);
                    __m256 _tmp2m = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _tmp02b, _tmp02a);
                    __m256 _tmp3m = _mm256_comp_fmadd_ps(_mm256_set1_ps(8.f), _tmp13b, _mm256_add_ps(_out0tm5, _tmp13a));

#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    _mm256_storeu_ps(tmp[0][m], _tmp0m);
                    _mm256_storeu_ps(tmp[1][m], _tmp1m);
                    _mm256_storeu_ps(tmp[2][m], _tmp2m);
                    _mm256_storeu_ps(tmp[3][m], _tmp3m);
#else
                    _mm256_store_ps(tmp[0][m], _tmp0m);
                    _mm256_store_ps(tmp[1][m], _tmp1m);
                    _mm256_store_ps(tmp[2][m], _tmp2m);
                    _mm256_store_ps(tmp[3][m], _tmp3m);
#endif

                    output0_tm_0 += tiles * 8 * 6;
                    output0_tm_1 += tiles * 8 * 6;
                    output0_tm_2 += tiles * 8 * 6;
                    output0_tm_3 += tiles * 8 * 6;
                    output0_tm_4 += tiles * 8 * 6;
                    output0_tm_5 += tiles * 8 * 6;
                }

                for (int m = 0; m < 4; m++)
                {
#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    __m256 _tmp00 = _mm256_loadu_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_loadu_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_loadu_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_loadu_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_loadu_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_loadu_ps(tmp[m][5]);
#else
                    __m256 _tmp00 = _mm256_load_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_load_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_load_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_load_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_load_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_load_ps(tmp[m][5]);
#endif

                    __m256 _tmp02a = _mm256_add_ps(_tmp01, _tmp02);
                    __m256 _tmp13a = _mm256_sub_ps(_tmp01, _tmp02);

                    __m256 _tmp02b = _mm256_add_ps(_tmp03, _tmp04);
                    __m256 _tmp13b = _mm256_sub_ps(_tmp03, _tmp04);

                    __m256 _out00 = _mm256_add_ps(_bias0, _mm256_add_ps(_mm256_add_ps(_tmp00, _tmp02a), _tmp02b));
                    __m256 _out01 = _mm256_add_ps(_bias0, _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp13b, _tmp13a));
                    __m256 _out02 = _mm256_add_ps(_bias0, _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _tmp02b, _tmp02a));
                    __m256 _out03 = _mm256_add_ps(_bias0, _mm256_comp_fmadd_ps(_mm256_set1_ps(8.f), _tmp13b, _mm256_add_ps(_tmp05, _tmp13a)));

                    _mm256_store_ps(output0, _out00);
                    _mm256_store_ps(output0 + 8, _out01);
                    _mm256_store_ps(output0 + 8 * 2, _out02);
                    _mm256_store_ps(output0 + 8 * 3, _out03);

                    output0 += outw * 8;
                }
            }
        }
    }
}